

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O0

exr_context_t createDummyFile(char *test)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  ostream *this;
  undefined8 in_RDI;
  exr_result_t _test_rv_1;
  exr_result_t _test_rv;
  exr_context_initializer_t cinit;
  exr_context_t f;
  char *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  uint uVar5;
  ostream *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined8 local_78 [2];
  code *local_68;
  code *local_40;
  undefined4 local_20;
  undefined4 local_1c;
  exr_context_t local_10;
  undefined8 local_8;
  
  uVar5 = (uint)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  local_10 = (exr_context_t)0x0;
  local_8 = in_RDI;
  memset(local_78,0,0x68);
  local_78[0] = 0x68;
  local_20 = 0xfffffffe;
  local_1c = 0xbf800000;
  local_40 = dummy_write;
  local_68 = failable_malloc;
  iVar1 = exr_start_write(&local_10,local_8,0,local_78);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    in_stack_ffffffffffffff78 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(in_stack_ffffffffffffff78,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)CONCAT44(iVar1,in_stack_ffffffffffffff80),
                   (char *)in_stack_ffffffffffffff78,uVar5,in_stack_ffffffffffffff68);
  }
  iVar2 = exr_add_part(local_10,"dummy",0,0);
  if (iVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar2);
    this = std::operator<<(poVar3,pcVar4);
    uVar5 = (uint)((ulong)poVar3 >> 0x20);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)CONCAT44(iVar1,iVar2),(char *)in_stack_ffffffffffffff78,uVar5,
                   in_stack_ffffffffffffff68);
  }
  return local_10;
}

Assistant:

static exr_context_t
createDummyFile (const char* test)
{
    exr_context_t             f     = NULL;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;

    // we won't actually write to this and so don't need a proper
    // stream but need a writable context to test with.
    cinit.write_fn = dummy_write;
    cinit.alloc_fn = failable_malloc;

    EXRCORE_TEST_RVAL (
        exr_start_write (&f, test, EXR_WRITE_FILE_DIRECTLY, &cinit));
    EXRCORE_TEST_RVAL (exr_add_part (f, "dummy", EXR_STORAGE_SCANLINE, NULL));
    return f;
}